

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawElementsBaseVertexTests.cpp
# Opt level: O1

void __thiscall
glcts::DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior::setUpTestCases
          (DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior *this)

{
  pointer *pp_Var1;
  GLuint *pGVar2;
  _function_type _Var3;
  int iVar4;
  uint uVar5;
  GLuint GVar6;
  long lVar7;
  GLuint GVar8;
  long lVar9;
  long lVar10;
  _function_type _Var11;
  _test_case *p_Var12;
  iterator __position;
  uint n_vertex_attrib_binding_status;
  long lVar13;
  bool bVar14;
  byte bVar15;
  GLuint *index_offsets [2];
  _test_case local_c0;
  GLuint *local_48 [3];
  
  bVar15 = 0;
  iVar4 = 0;
  do {
    uVar5 = (*((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.m_context)->
              m_renderCtx->_vptr_RenderContext[2])();
    if ((iVar4 == 0) || ((uVar5 & 0x300) == 0)) {
      DrawElementsBaseVertexTestBase::computeVBODataOffsets
                (&this->super_DrawElementsBaseVertexTestBase,iVar4 != 0,false);
      local_48[0] = (this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset;
      local_48[1] = (this->super_DrawElementsBaseVertexTestBase).m_draw_call_index2_offset;
      lVar7 = 0;
      do {
        pGVar2 = local_48[lVar7];
        _Var11 = FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX;
        GVar6 = 10;
        if (lVar7 == 0) {
          GVar6 = 0;
        }
        GVar8 = 0x20;
        if (lVar7 == 0) {
          GVar8 = 0x16;
        }
        do {
          if ((_Var11 != FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX) ||
             ((this->super_DrawElementsBaseVertexTestBase).m_is_ext_multi_draw_arrays_supported !=
              false)) {
            lVar10 = 0;
            do {
              lVar13 = 0;
              do {
                if (((this->super_DrawElementsBaseVertexTestBase).
                     m_is_vertex_attrib_binding_supported != false) ||
                   ((&DAT_01b642a0)[lVar13] == '\0')) {
                  local_c0.regular_draw_call_offset2._0_4_ = 0;
                  local_c0._76_8_ = 0;
                  local_c0.use_overflow_test_vertices = false;
                  local_c0.function_type = _Var11;
                  local_c0.basevertex = (&DAT_01b65f38)[lVar10];
                  local_c0.index_offset = pGVar2;
                  local_c0.range_end = GVar8;
                  local_c0.range_start = GVar6;
                  local_c0.index_type = 0x1405;
                  local_c0.primitive_mode = 4;
                  local_c0.regular_draw_call_offset = 10;
                  local_c0.should_base_texture_match_reference_texture = (bool)((byte)lVar10 ^ 1);
                  local_c0.use_clientside_index_data = (bool)(char)iVar4;
                  local_c0.use_clientside_vertex_data = false;
                  local_c0.use_geometry_shader_stage = false;
                  local_c0.use_tessellation_shader_stage = false;
                  local_c0.use_vertex_attrib_binding = (bool)(&DAT_01b642a0)[lVar13];
                  local_c0.multi_draw_call_count_array[0] = 3;
                  local_c0.multi_draw_call_count_array[1] = 6;
                  local_c0.multi_draw_call_count_array[2] = 3;
                  local_c0.multi_draw_call_indices_array[0] = pGVar2;
                  local_c0.multi_draw_call_indices_array[1] = pGVar2 + 3;
                  local_c0.multi_draw_call_indices_array[2] = pGVar2 + 9;
                  local_c0.regular_multi_draw_call_offseted_array[0] = (GLuint **)(pGVar2 + 10);
                  local_c0.regular_multi_draw_call_offseted_array[1]._0_7_ = SUB87(pGVar2 + 0xd,0);
                  local_c0.regular_multi_draw_call_offseted_array[1]._7_1_ =
                       (undefined1)((ulong)(pGVar2 + 0xd) >> 0x38);
                  local_c0.regular_multi_draw_call_offseted_array[2]._0_7_ = SUB87(pGVar2 + 0x13,0);
                  local_c0.regular_multi_draw_call_offseted_array[2]._7_1_ =
                       (undefined1)((ulong)(pGVar2 + 0x13) >> 0x38);
                  __position._M_current =
                       (this->super_DrawElementsBaseVertexTestBase).m_test_cases.
                       super__Vector_base<glcts::DrawElementsBaseVertexTestBase::_test_case,_std::allocator<glcts::DrawElementsBaseVertexTestBase::_test_case>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (this->super_DrawElementsBaseVertexTestBase).m_test_cases.
                      super__Vector_base<glcts::DrawElementsBaseVertexTestBase::_test_case,_std::allocator<glcts::DrawElementsBaseVertexTestBase::_test_case>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<glcts::DrawElementsBaseVertexTestBase::_test_case,std::allocator<glcts::DrawElementsBaseVertexTestBase::_test_case>>
                    ::_M_realloc_insert<glcts::DrawElementsBaseVertexTestBase::_test_case_const&>
                              ((vector<glcts::DrawElementsBaseVertexTestBase::_test_case,std::allocator<glcts::DrawElementsBaseVertexTestBase::_test_case>>
                                *)&(this->super_DrawElementsBaseVertexTestBase).m_test_cases,
                               __position,&local_c0);
                  }
                  else {
                    p_Var12 = &local_c0;
                    for (lVar9 = 0xf; lVar9 != 0; lVar9 = lVar9 + -1) {
                      _Var3 = p_Var12->function_type;
                      (__position._M_current)->basevertex = p_Var12->basevertex;
                      (__position._M_current)->function_type = _Var3;
                      p_Var12 = (_test_case *)((long)p_Var12 + ((ulong)bVar15 * -2 + 1) * 8);
                      __position._M_current = __position._M_current + (ulong)bVar15 * -0x10 + 8;
                    }
                    pp_Var1 = &(this->super_DrawElementsBaseVertexTestBase).m_test_cases.
                               super__Vector_base<glcts::DrawElementsBaseVertexTestBase::_test_case,_std::allocator<glcts::DrawElementsBaseVertexTestBase::_test_case>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *pp_Var1 = *pp_Var1 + 1;
                  }
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 == 1);
              bVar14 = lVar10 == 0;
              lVar10 = lVar10 + 1;
            } while (bVar14);
          }
          _Var11 = _Var11 + FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX;
        } while (_Var11 != FUNCTION_COUNT);
        bVar14 = lVar7 == 0;
        lVar7 = lVar7 + 1;
      } while (bVar14);
    }
    bVar14 = iVar4 == 0;
    iVar4 = iVar4 + 1;
  } while (bVar14);
  return;
}

Assistant:

void DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior::setUpTestCases()
{
	/* Set up test case descriptors */
	const glw::GLint   basevertex_values[] = { 10, 0 };
	const unsigned int n_basevertex_values = sizeof(basevertex_values) / sizeof(basevertex_values[0]);

	/* The test needs to be run in two iterations, using client-side memory and buffer object
	 * for index data respectively
	 */
	for (int vao_iteration = 0; vao_iteration < 2; ++vao_iteration)
	{
		/* Skip client-side vertex array as gl_VertexID is undefined when no buffer bound to ARRAY_BUFFER
		 *  See section 11.1.3.9 in OpenGL ES 3.1 spec
		 */
		bool use_clientside_vertex_data = 0;
		bool use_clientside_index_data  = ((vao_iteration & (1 << 0)) != 0);

		/* OpenGL does not support client-side data. */
		if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			if (use_clientside_index_data || use_clientside_vertex_data)
			{
				continue;
			}
		}

		/* Compute the offsets */
		computeVBODataOffsets(use_clientside_index_data, use_clientside_vertex_data);

		/* There are two index data sets we need to iterate over */
		const glw::GLuint* index_offsets[] = { m_draw_call_index_offset, m_draw_call_index2_offset };
		const unsigned int n_index_offsets = sizeof(index_offsets) / sizeof(index_offsets[0]);

		for (unsigned int n_index_offset = 0; n_index_offset < n_index_offsets; ++n_index_offset)
		{
			const glw::GLuint* current_index_offset = index_offsets[n_index_offset];

			/* We need to test four different functions:
			 *
			 * a)    glDrawElementsBaseVertex()             (GL)
			 *    or glDrawElementsBaseVertexEXT()          (ES)
			 * b)    glDrawRangeElementsBaseVertex()        (GL)
			 *    or glDrawRangeElementsBaseVertexEXT()     (ES)
			 * c)    glDrawElementsInstancedBaseVertex()    (GL)
			 *    or glDrawElementsInstancedBaseVertexEXT() (ES)
			 * d)    glMultiDrawElementsBaseVertex()        (GL)
			 *    or glMultiDrawElementsBaseVertexEXT()     (ES) (if supported)
			 **/
			for (int n_function = 0; n_function < FUNCTION_COUNT; ++n_function)
			{
				/* Do not try to use the multi draw call if relevant extension is
				 * not supported. */
				if (!m_is_ext_multi_draw_arrays_supported && n_function == FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX)
				{
					continue;
				}

				/* We need to run the test for a number of different basevertex values. */
				for (unsigned int n_basevertex_value = 0; n_basevertex_value < n_basevertex_values;
					 ++n_basevertex_value)
				{
					/* Finally, we want to verify that basevertex draw calls work correctly both when vertex attribute
					 * bindings are enabled and disabled */
					bool		 vertex_attrib_binding_statuses[] = { false, true };
					unsigned int n_vertex_attrib_binding_statuses =
						sizeof(vertex_attrib_binding_statuses) / sizeof(vertex_attrib_binding_statuses[0]);

					for (unsigned int n_vertex_attrib_binding_status = 0;
						 n_vertex_attrib_binding_status < n_vertex_attrib_binding_statuses;
						 ++n_vertex_attrib_binding_status)
					{
						bool use_vertex_attrib_binding = vertex_attrib_binding_statuses[n_vertex_attrib_binding_status];

						/* Under GL, "vertex attrib binding" functionality is only available if GL_ARB_vertex_attrib_binding
						 * extension is supported.
						 */
						if (!m_is_vertex_attrib_binding_supported && use_vertex_attrib_binding)
						{
							continue;
						}

						/* Prepare a few arrays so that we can handle the multi draw call and its emulated version.. */
						const glw::GLsizei multi_draw_call_count_array[3]   = { 3, 6, 3 };
						const glw::GLuint* multi_draw_call_indices_array[3] = {
							(glw::GLuint*)(current_index_offset), (glw::GLuint*)(current_index_offset + 3),
							(glw::GLuint*)(current_index_offset + 9)
						};

						/* Reference texture should always reflect basevertex=10 behavior. */
						const glw::GLuint  regular_draw_call_offset					 = basevertex_values[0];
						const glw::GLuint* regular_multi_draw_call_offseted_array[3] = {
							multi_draw_call_indices_array[0] + regular_draw_call_offset,
							multi_draw_call_indices_array[1] + regular_draw_call_offset,
							multi_draw_call_indices_array[2] + regular_draw_call_offset,
						};

						/* Construct the test case descriptor */
						_test_case new_test_case;

						new_test_case.basevertex			   = basevertex_values[n_basevertex_value];
						new_test_case.function_type			   = (_function_type)n_function;
						new_test_case.index_offset			   = current_index_offset;
						new_test_case.range_start			   = n_index_offset == 0 ? 0 : 10;
						new_test_case.range_end				   = n_index_offset == 0 ? 22 : 32;
						new_test_case.index_type			   = GL_UNSIGNED_INT;
						new_test_case.primitive_mode		   = GL_TRIANGLES;
						new_test_case.regular_draw_call_offset = basevertex_values[0];
						new_test_case.should_base_texture_match_reference_texture =
							((glw::GLuint)new_test_case.basevertex == new_test_case.regular_draw_call_offset);
						new_test_case.use_clientside_index_data		= use_clientside_index_data;
						new_test_case.use_clientside_vertex_data	= use_clientside_vertex_data;
						new_test_case.use_geometry_shader_stage		= false;
						new_test_case.use_tessellation_shader_stage = false;
						new_test_case.use_vertex_attrib_binding		= use_vertex_attrib_binding;

						memcpy(new_test_case.multi_draw_call_count_array, multi_draw_call_count_array,
							   sizeof(multi_draw_call_count_array));
						memcpy(new_test_case.multi_draw_call_indices_array, multi_draw_call_indices_array,
							   sizeof(multi_draw_call_indices_array));
						memcpy(new_test_case.regular_multi_draw_call_offseted_array,
							   regular_multi_draw_call_offseted_array, sizeof(regular_multi_draw_call_offseted_array));

						m_test_cases.push_back(new_test_case);
					} /* for (all vertex_attrib_binding statuses) */
				}	 /* for (all basevertex values) */
			}		  /* for (all four functions) */
		}			  /* for (all index data sets) */
	}				  /* for (all VAO iterations) */
}